

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O1

void libyuv::ScalePlaneDown4
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint8_t *src_ptr,uint8_t *dst_ptr,FilterMode filtering)

{
  uint uVar1;
  int iVar2;
  code *pcVar3;
  long lVar4;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  code *pcVar5;
  long lVar6;
  
  lVar4 = CONCAT44(in_register_0000008c,dst_stride);
  if ((uint)src_ptr == 0) {
    iVar2 = dst_width * 2;
    pcVar5 = ScaleRowDown4_C;
  }
  else {
    iVar2 = 0;
    pcVar5 = ScaleRowDown4Box_C;
  }
  uVar1 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar1 = InitCpuFlags();
  }
  if ((uVar1 & 0x40) != 0) {
    pcVar3 = ScaleRowDown4Box_Any_SSSE3;
    if ((uint)src_ptr == 0) {
      pcVar3 = ScaleRowDown4_Any_SSSE3;
    }
    pcVar5 = ScaleRowDown4Box_SSSE3;
    if ((uint)src_ptr == 0) {
      pcVar5 = ScaleRowDown4_SSSE3;
    }
    if ((src_width & 7U) != 0) {
      pcVar5 = pcVar3;
    }
  }
  uVar1 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar1 = InitCpuFlags();
  }
  if ((uVar1 >> 10 & 1) != 0) {
    pcVar3 = ScaleRowDown4Box_Any_AVX2;
    if ((uint)src_ptr == 0) {
      pcVar3 = ScaleRowDown4_Any_AVX2;
    }
    pcVar5 = ScaleRowDown4Box_AVX2;
    if ((uint)src_ptr == 0) {
      pcVar5 = ScaleRowDown4_AVX2;
    }
    if ((src_width & 0xfU) != 0) {
      pcVar5 = pcVar3;
    }
  }
  if (0 < src_height) {
    lVar6 = CONCAT44(in_register_00000084,src_stride) + (long)iVar2;
    iVar2 = 0;
    if (1 < (uint)src_ptr) {
      iVar2 = dst_width;
    }
    do {
      (*pcVar5)(lVar6,(long)iVar2,lVar4,src_width);
      lVar6 = lVar6 + dst_width * 4;
      lVar4 = lVar4 + dst_height;
      src_height = src_height + -1;
    } while (src_height != 0);
  }
  return;
}

Assistant:

static void ScalePlaneDown4(int src_width,
                            int src_height,
                            int dst_width,
                            int dst_height,
                            int src_stride,
                            int dst_stride,
                            const uint8_t* src_ptr,
                            uint8_t* dst_ptr,
                            enum FilterMode filtering) {
  int y;
  void (*ScaleRowDown4)(const uint8_t* src_ptr, ptrdiff_t src_stride,
                        uint8_t* dst_ptr, int dst_width) =
      filtering ? ScaleRowDown4Box_C : ScaleRowDown4_C;
  int row_stride = src_stride << 2;
  (void)src_width;
  (void)src_height;
  if (!filtering) {
    src_ptr += src_stride * 2;  // Point to row 2.
    src_stride = 0;
  }
#if defined(HAS_SCALEROWDOWN4_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ScaleRowDown4 =
        filtering ? ScaleRowDown4Box_Any_NEON : ScaleRowDown4_Any_NEON;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleRowDown4 = filtering ? ScaleRowDown4Box_NEON : ScaleRowDown4_NEON;
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN4_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    ScaleRowDown4 =
        filtering ? ScaleRowDown4Box_Any_SSSE3 : ScaleRowDown4_Any_SSSE3;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleRowDown4 = filtering ? ScaleRowDown4Box_SSSE3 : ScaleRowDown4_SSSE3;
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN4_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ScaleRowDown4 =
        filtering ? ScaleRowDown4Box_Any_AVX2 : ScaleRowDown4_Any_AVX2;
    if (IS_ALIGNED(dst_width, 16)) {
      ScaleRowDown4 = filtering ? ScaleRowDown4Box_AVX2 : ScaleRowDown4_AVX2;
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN4_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ScaleRowDown4 =
        filtering ? ScaleRowDown4Box_Any_MMI : ScaleRowDown4_Any_MMI;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleRowDown4 = filtering ? ScaleRowDown4Box_MMI : ScaleRowDown4_MMI;
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN4_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ScaleRowDown4 =
        filtering ? ScaleRowDown4Box_Any_MSA : ScaleRowDown4_Any_MSA;
    if (IS_ALIGNED(dst_width, 16)) {
      ScaleRowDown4 = filtering ? ScaleRowDown4Box_MSA : ScaleRowDown4_MSA;
    }
  }
#endif

  if (filtering == kFilterLinear) {
    src_stride = 0;
  }
  for (y = 0; y < dst_height; ++y) {
    ScaleRowDown4(src_ptr, src_stride, dst_ptr, dst_width);
    src_ptr += row_stride;
    dst_ptr += dst_stride;
  }
}